

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O1

ValuedAction __thiscall despot::POMCP::Search(POMCP *this,double timeout)

{
  Belief *pBVar1;
  State *pSVar2;
  DSPOMDP *pDVar3;
  int iVar4;
  int iVar5;
  clock_t cVar6;
  VNode *pVVar7;
  log_ostream *plVar8;
  long *plVar9;
  ostream *poVar10;
  ulong uVar11;
  QNode *pQVar12;
  bool bVar13;
  ulong uVar14;
  size_type __new_size;
  double dVar15;
  ValuedAction VVar16;
  timeval tv;
  ValuedAction astar;
  timeval local_98;
  long local_88;
  double local_80;
  double local_78;
  ValuedAction local_70;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  double local_48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_40;
  History *local_38;
  
  local_48 = timeout;
  cVar6 = clock();
  uVar11 = 0;
  gettimeofday(&local_98,(__timezone_ptr_t)0x0);
  dVar15 = (double)local_98.tv_sec;
  local_80 = (double)local_98.tv_usec / 1000000.0;
  if (this->root_ == (VNode *)0x0) {
    pBVar1 = (this->super_Solver).belief_;
    (*pBVar1->_vptr_Belief[2])(&local_98,pBVar1,1);
    pSVar2 = *(State **)local_98.tv_sec;
    operator_delete((void *)local_98.tv_sec,local_88 - local_98.tv_sec);
    pVVar7 = CreateVNode(0,pSVar2,this->prior_,(this->super_Solver).model_);
    this->root_ = pVVar7;
    pDVar3 = (this->super_Solver).model_;
    (*pDVar3->_vptr_DSPOMDP[0x17])(pDVar3,pSVar2);
  }
  local_78 = (double)cVar6;
  local_80 = local_80 + dVar15;
  local_38 = &(this->super_Solver).history_;
  __new_size = (size_type)
               (int)((ulong)((long)(this->super_Solver).history_.actions_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(this->super_Solver).history_.actions_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
  local_40 = &(this->super_Solver).history_.observations_;
  bVar13 = false;
  do {
    pBVar1 = (this->super_Solver).belief_;
    (*pBVar1->_vptr_Belief[2])(&local_98,pBVar1,1000);
    if (local_98.tv_usec != local_98.tv_sec) {
      local_58 = (ulong)((int)uVar11 + 1);
      uVar14 = 0;
      local_60 = uVar11;
      local_50 = uVar11;
      do {
        pSVar2 = *(State **)(local_98.tv_sec + uVar14 * 8);
        iVar4 = logging::level();
        iVar5 = (int)uVar14;
        if ((0 < iVar4) && (iVar4 = logging::level(), 3 < iVar4)) {
          plVar8 = logging::stream(4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&plVar8->super_ostream,"[POMCP::Search] Starting simulation ",0x24);
          plVar9 = (long *)std::ostream::operator<<(plVar8,(int)local_50 + iVar5);
          std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
          std::ostream::put((char)plVar9);
          std::ostream::flush();
        }
        Simulate(pSVar2,this->root_,(this->super_Solver).model_,this->prior_);
        iVar4 = logging::level();
        if ((0 < iVar4) && (iVar4 = logging::level(), 3 < iVar4)) {
          plVar8 = logging::stream(4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&plVar8->super_ostream,"[POMCP::Search] ",0x10);
          poVar10 = (ostream *)std::ostream::operator<<(plVar8,(int)local_58 + iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," simulations done",0x11);
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
        }
        std::vector<int,_std::allocator<int>_>::resize(&local_38->actions_,__new_size);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_40,__new_size);
        cVar6 = clock();
        if (local_48 <= ((double)cVar6 - local_78) / 1000000.0) {
          bVar13 = true;
          break;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < (ulong)(local_98.tv_usec - local_98.tv_sec >> 3));
      uVar11 = (ulong)((int)local_60 + iVar5 + 1);
    }
    if (local_98.tv_usec != local_98.tv_sec) {
      uVar14 = 0;
      do {
        pDVar3 = (this->super_Solver).model_;
        (*pDVar3->_vptr_DSPOMDP[0x17])(pDVar3,*(undefined8 *)(local_98.tv_sec + uVar14 * 8));
        uVar14 = uVar14 + 1;
      } while (uVar14 < (ulong)(local_98.tv_usec - local_98.tv_sec >> 3));
    }
    if ((undefined8 *)local_98.tv_sec != (undefined8 *)0x0) {
      operator_delete((void *)local_98.tv_sec,local_88 - local_98.tv_sec);
    }
    if (bVar13) {
      VVar16 = OptimalAction(this->root_);
      local_70.value = VVar16.value;
      local_70.action = VVar16.action;
      iVar4 = logging::level();
      if ((0 < iVar4) && (iVar4 = logging::level(), 2 < iVar4)) {
        plVar8 = logging::stream(3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&plVar8->super_ostream,"[POMCP::Search] Search statistics",0x21);
        std::ios::widen((char)(plVar8->super_ostream)._vptr_basic_ostream[-3] + (char)plVar8);
        std::ostream::put((char)plVar8);
        poVar10 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"OptimalAction = ",0x10);
        poVar10 = despot::operator<<(poVar10,&local_70);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        poVar10 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"# Simulations = ",0x10);
        iVar4 = VNode::count(this->root_);
        plVar9 = (long *)std::ostream::operator<<(poVar10,iVar4);
        std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
        std::ostream::put((char)plVar9);
        poVar10 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Time: CPU / Real = ",0x13);
        cVar6 = clock();
        poVar10 = std::ostream::_M_insert<double>(((double)cVar6 - local_78) / 1000000.0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," / ",3);
        gettimeofday(&local_98,(__timezone_ptr_t)0x0);
        poVar10 = std::ostream::_M_insert<double>
                            (((double)local_98.tv_usec / 1000000.0 + (double)local_98.tv_sec) -
                             local_80);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        poVar10 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"# active particles = ",0x15);
        iVar4 = (*((this->super_Solver).model_)->_vptr_DSPOMDP[0x18])();
        plVar9 = (long *)std::ostream::operator<<(poVar10,iVar4);
        std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
        std::ostream::put((char)plVar9);
        poVar10 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Tree size = ",0xc);
        iVar4 = VNode::Size(this->root_);
        plVar9 = (long *)std::ostream::operator<<(poVar10,iVar4);
        std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
        std::ostream::put((char)plVar9);
        std::ostream::flush();
      }
      if ((local_70.action == 0xffffffff) &&
         (iVar4 = (*((this->super_Solver).model_)->_vptr_DSPOMDP[5])(), 0 < iVar4)) {
        iVar4 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"action ",7);
          poVar10 = (ostream *)std::ostream::operator<<(&std::cout,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
          pQVar12 = VNode::Child(this->root_,iVar4);
          iVar5 = QNode::count(pQVar12);
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          pQVar12 = VNode::Child(this->root_,iVar4);
          dVar15 = QNode::value(pQVar12);
          poVar10 = std::ostream::_M_insert<double>(dVar15);
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          iVar4 = iVar4 + 1;
          iVar5 = (*((this->super_Solver).model_)->_vptr_DSPOMDP[5])();
        } while (iVar4 < iVar5);
      }
      VVar16._4_4_ = 0;
      VVar16.action = local_70.action;
      VVar16.value = local_70.value;
      return VVar16;
    }
  } while( true );
}

Assistant:

ValuedAction POMCP::Search(double timeout) {
	double start_cpu = clock(), start_real = get_time_second();

	if (root_ == NULL) {
		State* state = belief_->Sample(1)[0];
		root_ = CreateVNode(0, state, prior_, model_);
		model_->Free(state);
	}

	int hist_size = history_.Size();
	bool done = false;
	int num_sims = 0;
	while (true) {
		vector<State*> particles = belief_->Sample(1000);
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			logd << "[POMCP::Search] Starting simulation " << num_sims << endl;

			Simulate(particle, root_, model_, prior_);
 
			num_sims++;
			logd << "[POMCP::Search] " << num_sims << " simulations done" << endl;
			history_.Truncate(hist_size);

			if ((clock() - start_cpu) / CLOCKS_PER_SEC >= timeout) {
				done = true;
				break;
			}
		}

		for (int i = 0; i < particles.size(); i++) {
			model_->Free(particles[i]);
		}

		if (done)
			break;
	}

	ValuedAction astar = OptimalAction(root_);

	logi << "[POMCP::Search] Search statistics" << endl
		<< "OptimalAction = " << astar << endl 
		<< "# Simulations = " << root_->count() << endl
		<< "Time: CPU / Real = " << ((clock() - start_cpu) / CLOCKS_PER_SEC) << " / " << (get_time_second() - start_real) << endl
		<< "# active particles = " << model_->NumActiveParticles() << endl
		<< "Tree size = " << root_->Size() << endl;

	if (astar.action == -1) {
		for (ACT_TYPE action = 0; action < model_->NumActions(); action++) {
			cout << "action " << action << ": " << root_->Child(action)->count()
				<< " " << root_->Child(action)->value() << endl;
		}
	}

	// delete root_;
	return astar;
}